

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O1

void __thiscall mjs::print_visitor::operator()(print_visitor *this,call_expression *e)

{
  wostream *pwVar1;
  long *plVar2;
  char *pcVar3;
  ulong uVar4;
  wchar_t local_30;
  wchar_t local_2c;
  
  accept<mjs::print_visitor>
            ((e->member_)._M_t.
             super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>._M_t.
             super__Tuple_impl<0UL,_mjs::expression_*,_std::default_delete<mjs::expression>_>.
             super__Head_base<0UL,_mjs::expression_*,_false>._M_head_impl,this);
  pwVar1 = this->os_;
  plVar2 = *(long **)(pwVar1 + *(long *)(*(long *)pwVar1 + -0x18) + 0xf0);
  if (plVar2 != (long *)0x0) {
    local_30 = (**(code **)(*plVar2 + 0x50))(plVar2,0x28);
    std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar1,&local_30,1);
    if ((e->arguments_).
        super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (e->arguments_).
        super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar4 = 0;
      do {
        pcVar3 = "], ";
        if (uVar4 == 0) {
          pcVar3 = "\t";
        }
        std::operator<<(this->os_,pcVar3 + 1);
        accept<mjs::print_visitor>
                  ((expression *)
                   (e->arguments_).
                   super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t.
                   super___uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>.
                   _M_t,this);
        uVar4 = uVar4 + 1;
      } while (uVar4 < (ulong)((long)(e->arguments_).
                                     super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(e->arguments_).
                                     super__Vector_base<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3));
    }
    pwVar1 = this->os_;
    plVar2 = *(long **)(pwVar1 + *(long *)(*(long *)pwVar1 + -0x18) + 0xf0);
    if (plVar2 != (long *)0x0) {
      local_2c = (**(code **)(*plVar2 + 0x50))(plVar2,0x29);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar1,&local_2c,1);
      return;
    }
  }
  std::__throw_bad_cast();
}

Assistant:

void operator()(const call_expression& e) {
        accept(e.member(), *this);
        os_ << '(';
        const auto& args = e.arguments();
        for (size_t i = 0; i < args.size(); ++i) {
            os_ << (i ? ", " : "");
            accept(*args[i], *this);
        }
        os_ << ')';
    }